

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCreateWithNode(char *pSop)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Vec_Ptr_t *vNames_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_3c;
  int nVars;
  int i;
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pNodePo;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pNtkNew;
  char *pSop_local;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_UtilStrsav("ex");
  pNtk->pName = pcVar2;
  Vec_PtrPush(pNtk->vObjs,(void *)0x0);
  iVar1 = Abc_SopGetVarNum(pSop);
  vNames_00 = Abc_NodeGetFakeNames(iVar1);
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCreatePi(pNtk);
    pcVar2 = (char *)Vec_PtrEntry(vNames_00,local_3c);
    Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
  }
  Abc_NodeFreeNames(vNames_00);
  pAVar3 = Abc_NtkCreateNode(pNtk);
  for (local_3c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar4 = Abc_NtkPi(pNtk,local_3c);
    Abc_ObjAddFanin(pAVar3,pAVar4);
  }
  pcVar2 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pSop);
  (pAVar3->field_5).pData = pcVar2;
  pAVar4 = Abc_NtkCreatePo(pNtk);
  Abc_ObjAddFanin(pAVar4,pAVar3);
  Abc_ObjAssignName(pAVar4,"F",(char *)0x0);
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    fprintf(_stdout,"Abc_NtkCreateWithNode(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateWithNode( char * pSop )
{    
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pFanin, * pNode, * pNodePo;
    Vec_Ptr_t * vNames;
    int i, nVars;
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtkNew->pName = Extra_UtilStrsav("ex");
    // create PIs
    Vec_PtrPush( pNtkNew->vObjs, NULL );
    nVars = Abc_SopGetVarNum( pSop );
    vNames = Abc_NodeGetFakeNames( nVars );
    for ( i = 0; i < nVars; i++ )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtkNew), (char *)Vec_PtrEntry(vNames, i), NULL );
    Abc_NodeFreeNames( vNames );
    // create the node, add PIs as fanins, set the function
    pNode = Abc_NtkCreateNode( pNtkNew );
    Abc_NtkForEachPi( pNtkNew, pFanin, i )
        Abc_ObjAddFanin( pNode, pFanin );
    pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, pSop );
    // create the only PO
    pNodePo = Abc_NtkCreatePo(pNtkNew);
    Abc_ObjAddFanin( pNodePo, pNode );
    Abc_ObjAssignName( pNodePo, "F", NULL );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateWithNode(): Network check has failed.\n" );
    return pNtkNew;
}